

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O2

void __thiscall
LASreadItemCompressed_RGB12_v2::~LASreadItemCompressed_RGB12_v2
          (LASreadItemCompressed_RGB12_v2 *this)

{
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015f9a0;
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_byte_used);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_rgb_diff_0);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_rgb_diff_1);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_rgb_diff_2);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_rgb_diff_3);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_rgb_diff_4);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_rgb_diff_5);
  return;
}

Assistant:

LASreadItemCompressed_RGB12_v2::~LASreadItemCompressed_RGB12_v2()
{
  dec->destroySymbolModel(m_byte_used);
  dec->destroySymbolModel(m_rgb_diff_0);
  dec->destroySymbolModel(m_rgb_diff_1);
  dec->destroySymbolModel(m_rgb_diff_2);
  dec->destroySymbolModel(m_rgb_diff_3);
  dec->destroySymbolModel(m_rgb_diff_4);
  dec->destroySymbolModel(m_rgb_diff_5);
}